

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

void google::protobuf::compiler::ruby::GenerateField(FieldDescriptor *field,Printer *printer)

{
  _func_void_FieldDescriptor_ptr *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  bool bVar2;
  FieldDescriptor FVar3;
  int iVar4;
  Descriptor *pDVar5;
  FieldDescriptor *pFVar6;
  FieldDescriptor *this;
  FieldDescriptor *in_RDX;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  string local_48;
  
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_88._0_8_ = FieldDescriptor::TypeOnceInit;
    local_68._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_88,
               (FieldDescriptor **)local_68);
    in_RDX = extraout_RDX;
  }
  if ((field[2] == (FieldDescriptor)0xb) &&
     (bVar2 = FieldDescriptor::is_map_message_type(field), in_RDX = extraout_RDX_00, bVar2)) {
    pDVar5 = FieldDescriptor::message_type(field);
    pFVar6 = Descriptor::FindFieldByNumber(pDVar5,1);
    pDVar5 = FieldDescriptor::message_type(field);
    this = Descriptor::FindFieldByNumber(pDVar5,2);
    args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 8);
    TypeName_abi_cxx11_((string *)local_88,(ruby *)pFVar6,field_00);
    TypeName_abi_cxx11_((string *)local_68,(ruby *)this,field_01);
    NumberToString<int>(&local_48,*(int *)(field + 4));
    io::Printer::
    Print<char[5],std::__cxx11::string,char[9],std::__cxx11::string,char[11],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,"map :$name$, :$key_type$, :$value_type$, $number$",(char (*) [5])0x3ea8a1,
               args_1,(char (*) [9])0x4192f7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               (char (*) [11])0x4193e8,(string *)local_68,(char (*) [7])0x3ff2bd,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_68._0_8_ != (FieldDescriptor *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_88._0_8_ = FieldDescriptor::TypeOnceInit;
      local_68._0_8_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)local_88,
                 (FieldDescriptor **)local_68);
    }
    iVar4 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4);
    if (iVar4 == 10) {
      pDVar5 = FieldDescriptor::message_type(this);
    }
    else {
      if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
        local_88._0_8_ = FieldDescriptor::TypeOnceInit;
        local_68._0_8_ = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)local_88,
                   (FieldDescriptor **)local_68);
        iVar4 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4);
      }
      if (iVar4 != 8) goto LAB_0028f927;
      pDVar5 = (Descriptor *)FieldDescriptor::enum_type(this);
    }
    io::Printer::Print<char[8],std::__cxx11::string>
              (printer,", \"$subtype$\"\n",(char (*) [8])"subtype",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)(pDVar5 + 8) + 0x20));
  }
  else {
    LabelForField_abi_cxx11_((string *)local_88,(ruby *)field,in_RDX);
    io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"$label$ :$name$, ",(char (*) [6])"label",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               (char (*) [5])0x3ea8a1,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 8));
    p_Var1 = (_func_void_FieldDescriptor_ptr *)(local_88 + 0x10);
    pFVar6 = extraout_RDX_01;
    if ((_func_void_FieldDescriptor_ptr *)local_88._0_8_ != p_Var1) {
      operator_delete((void *)local_88._0_8_);
      pFVar6 = extraout_RDX_02;
    }
    TypeName_abi_cxx11_((string *)local_88,(ruby *)field,pFVar6);
    NumberToString<int>((string *)local_68,*(int *)(field + 4));
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,":$type$, $number$",(char (*) [5])0x43947f,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               (char (*) [7])0x3ff2bd,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    pFVar6 = extraout_RDX_03;
    if ((FieldDescriptor *)local_68._0_8_ != (FieldDescriptor *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_);
      pFVar6 = extraout_RDX_04;
    }
    if ((_func_void_FieldDescriptor_ptr *)local_88._0_8_ != p_Var1) {
      operator_delete((void *)local_88._0_8_);
      pFVar6 = extraout_RDX_05;
    }
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_88._0_8_ = FieldDescriptor::TypeOnceInit;
      local_68._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_88,
                 (FieldDescriptor **)local_68);
      pFVar6 = extraout_RDX_06;
    }
    iVar4 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
    if (iVar4 == 10) {
      pDVar5 = FieldDescriptor::message_type(field);
LAB_0028f8a0:
      io::Printer::Print<char[8],std::__cxx11::string>
                (printer,", \"$subtype$\"",(char (*) [8])"subtype",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(pDVar5 + 8) + 0x20));
      pFVar6 = extraout_RDX_08;
    }
    else {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_88._0_8_ = FieldDescriptor::TypeOnceInit;
        local_68._0_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_88,
                   (FieldDescriptor **)local_68);
        iVar4 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
        pFVar6 = extraout_RDX_07;
      }
      if (iVar4 == 8) {
        pDVar5 = (Descriptor *)FieldDescriptor::enum_type(field);
        goto LAB_0028f8a0;
      }
    }
    FVar3 = field[1];
    if (((byte)FVar3 & 1) != 0) {
      DefaultValueForField_abi_cxx11_((string *)local_88,(ruby *)field,pFVar6);
      io::Printer::Print<char[8],std::__cxx11::string>
                (printer,", default: $default$",(char (*) [8])0x3e04cb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      if ((_func_void_FieldDescriptor_ptr *)local_88._0_8_ != p_Var1) {
        operator_delete((void *)local_88._0_8_);
      }
      FVar3 = field[1];
    }
    if (((byte)FVar3 & 4) != 0) {
      io::Printer::Print<char[10],std::__cxx11::string>
                (printer,", json_name: \"$json_name$\"",(char (*) [10])0x437c02,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(((byte)field[3] & 0x70) * 2) + *(long *)(field + 8)));
    }
LAB_0028f927:
    io::Printer::Print<>(printer,"\n");
  }
  return;
}

Assistant:

void GenerateField(const FieldDescriptor* field, io::Printer* printer) {
  if (field->is_map()) {
    const FieldDescriptor* key_field =
        field->message_type()->FindFieldByNumber(1);
    const FieldDescriptor* value_field =
        field->message_type()->FindFieldByNumber(2);

    printer->Print(
      "map :$name$, :$key_type$, :$value_type$, $number$",
      "name", field->name(),
      "key_type", TypeName(key_field),
      "value_type", TypeName(value_field),
      "number", NumberToString(field->number()));

    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->message_type()->full_name());
    } else if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  } else {

    printer->Print(
      "$label$ :$name$, ",
      "label", LabelForField(field),
      "name", field->name());
    printer->Print(
      ":$type$, $number$",
      "type", TypeName(field),
      "number", NumberToString(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"",
       "subtype", field->message_type()->full_name());
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"",
        "subtype", field->enum_type()->full_name());
    }

    if (field->has_default_value()) {
      printer->Print(", default: $default$", "default",
                     DefaultValueForField(field));
    }

    if (field->has_json_name()) {
      printer->Print(", json_name: \"$json_name$\"", "json_name",
                    field->json_name());
    }

    printer->Print("\n");
  }
}